

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O0

CVmTimeZone * CVmTimeZone::load(ZoneHashEntry *entry)

{
  uint uVar1;
  FILE *__stream;
  size_t sVar2;
  long *in_RDI;
  bool bVar3;
  CVmTimeZone *tz;
  uint abbr_bytes;
  uint rule_cnt;
  uint type_cnt;
  uint trans_cnt;
  char *buf;
  uint alo;
  int ok;
  char pfx [2];
  osfildef *fp;
  uint in_stack_000000c4;
  uint in_stack_000000c8;
  uint in_stack_000000cc;
  char *in_stack_000000d0;
  ZoneHashEntryDb *in_stack_000000d8;
  CVmTimeZone *in_stack_000000e0;
  uint in_stack_000000f0;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  void *local_78;
  CVmTimeZone *local_60;
  undefined1 local_1a [2];
  ZoneHashEntry *in_stack_ffffffffffffffe8;
  CVmTimeZone *local_8;
  
  if (*(int *)((long)in_RDI + 0x24) == 1) {
    __stream = (FILE *)CVmTimeZoneCache::open_zoneinfo_file();
    if (__stream == (FILE *)0x0) {
      local_8 = (CVmTimeZone *)0x0;
    }
    else {
      fseek(__stream,(ulong)*(uint *)(in_RDI + 8),0);
      sVar2 = fread(local_1a,2,1,__stream);
      uVar1 = ::osrp2(local_1a);
      if (sVar2 == 1) {
        local_78 = operator_new__((ulong)uVar1);
      }
      else {
        local_78 = (void *)0x0;
      }
      bVar3 = false;
      if (local_78 != (void *)0x0) {
        sVar2 = fread(local_78,(ulong)uVar1,1,__stream);
        bVar3 = sVar2 == 1;
      }
      ::osrp2(local_78);
      ::osrp2((void *)((long)local_78 + 2));
      local_60 = (CVmTimeZone *)0x0;
      if (bVar3) {
        local_60 = (CVmTimeZone *)operator_new(0x68);
        CVmTimeZone(in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000cc,
                    in_stack_000000c8,in_stack_000000c4,in_stack_000000f0);
      }
      if ((local_78 != (void *)0x0) && (local_78 != (void *)0x0)) {
        operator_delete__(local_78);
      }
      fclose(__stream);
      local_8 = local_60;
    }
  }
  else if (*(int *)((long)in_RDI + 0x24) == 2) {
    (**(code **)(*in_RDI + 0x18))();
    local_8 = load(in_stack_ffffffffffffffe8);
  }
  else if (*(int *)((long)in_RDI + 0x24) == 3) {
    local_8 = (CVmTimeZone *)operator_new(0x68);
    CVmTimeZone(local_8,(ZoneHashEntrySynth *)
                        CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  }
  else {
    local_8 = (CVmTimeZone *)0x0;
  }
  return local_8;
}

Assistant:

CVmTimeZone *CVmTimeZone::load(VMG_ ZoneHashEntry *entry)
{
    /* load according to the data source in the hash table entry */
    if (entry->typ == ZONE_HASH_DB)
    {
        /* it's in the database file - open the file */
        osfildef *fp = CVmTimeZoneCache::open_zoneinfo_file(vmg0_);
        if (fp == 0)
            return 0;

        /* seek to our data */
        osfseek(fp, ((ZoneHashEntryDb *)entry)->seekpos, OSFSK_SET);

        /* read the length prefix */
        char pfx[2];
        int ok = !osfrb(fp, pfx, 2);
        
        /* allocate space for the file data */
        unsigned int alo = osrp2(pfx);
        char *buf = ok ? new char[alo] : 0;
        
        /* read the file data */
        ok = buf != 0 && !osfrb(fp, buf, alo);
        
        /* decode the header */
        unsigned int trans_cnt = osrp2(buf);
        unsigned int type_cnt = osrp2(buf+2);
        unsigned int rule_cnt = osrp1(buf+4);
        unsigned int abbr_bytes = osrp1(buf+5);
        
        /* create the time zone object */
        CVmTimeZone *tz = 0;
        if (ok)
        {
            tz = new CVmTimeZone(
                (ZoneHashEntryDb *)entry,
                buf+6, trans_cnt, type_cnt, rule_cnt, abbr_bytes);
        }

        /* release resources */
        if (buf != 0)
            delete [] buf;
        osfcls(fp);

        /* return the loaded object */
        return tz;
    }
    else if (entry->typ == ZONE_HASH_LINK)
    {
        /* load from the linked object */
        return load(vmg_ entry->resolve_links());
    }
    else if (entry->typ == ZONE_HASH_SYNTH)
    {
        /* create from the zone descriptor */
        return new CVmTimeZone((ZoneHashEntrySynth *)entry);
    }
    else
    {
        /* unknown type */
        return 0;
    }
}